

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O1

void __thiscall Future<void>::Private::ThreadPool::~ThreadPool(ThreadPool *this)

{
  usize *puVar1;
  Item *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  usize uVar6;
  Node *pNVar7;
  ulong uVar8;
  Item *pIVar9;
  bool bVar10;
  Job job;
  
  pIVar2 = (this->_threads)._end.item;
  pIVar9 = (this->_threads)._begin.item;
  if (pIVar9 != pIVar2) {
LAB_001194f2:
    do {
      uVar5 = (this->_queue)._tail;
      do {
        uVar4 = uVar5;
        pNVar7 = (this->_queue)._queue;
        uVar8 = (this->_queue)._capacityMask & uVar4;
        uVar3 = pNVar7[uVar8].tail;
        if (uVar3 != uVar4) goto LAB_00119531;
        puVar1 = &(this->_queue)._tail;
        LOCK();
        uVar5 = *puVar1;
        bVar10 = uVar4 == uVar5;
        if (bVar10) {
          *puVar1 = uVar4 + 1;
          uVar5 = uVar4;
        }
        UNLOCK();
      } while (!bVar10);
      pNVar7 = pNVar7 + uVar8;
      (pNVar7->data).proc = (_func_void_void_ptr *)0x0;
      (pNVar7->data).args = (void *)0x0;
      LOCK();
      pNVar7->head = uVar4;
      UNLOCK();
      if (uVar3 != uVar4) {
LAB_00119531:
        LOCK();
        puVar1 = &(this->_dequeuedSignal)._state;
        uVar6 = *puVar1;
        *puVar1 = 0;
        UNLOCK();
        if (uVar6 == 1) {
          Signal::reset(&(this->_dequeuedSignal)._signal);
        }
        uVar5 = (this->_queue)._tail;
        do {
          uVar4 = uVar5;
          pNVar7 = (this->_queue)._queue;
          uVar8 = (this->_queue)._capacityMask & uVar4;
          uVar3 = pNVar7[uVar8].tail;
          if (uVar3 != uVar4) goto code_r0x0011958a;
          puVar1 = &(this->_queue)._tail;
          LOCK();
          uVar5 = *puVar1;
          bVar10 = uVar4 == uVar5;
          if (bVar10) {
            *puVar1 = uVar4 + 1;
            uVar5 = uVar4;
          }
          UNLOCK();
        } while (!bVar10);
        pNVar7 = pNVar7 + uVar8;
        (pNVar7->data).proc = (_func_void_void_ptr *)0x0;
        (pNVar7->data).args = (void *)0x0;
        LOCK();
        pNVar7->head = uVar4;
        UNLOCK();
        if (uVar3 != uVar4) {
code_r0x0011958a:
          if ((this->_dequeuedSignal)._state == 0) {
            Signal::wait(&(this->_dequeuedSignal)._signal,(void *)(uVar8 * 0x20));
          }
          goto LAB_001194f2;
        }
      }
      LOCK();
      puVar1 = &(this->_enqueuedSignal)._state;
      uVar6 = *puVar1;
      *puVar1 = 1;
      UNLOCK();
      if (uVar6 == 0) {
        Signal::set(&(this->_enqueuedSignal)._signal);
      }
      pIVar9 = pIVar9->next;
    } while (pIVar9 != pIVar2);
  }
  pIVar2 = (this->_threads)._end.item;
  for (pIVar9 = (this->_threads)._begin.item; pIVar9 != pIVar2; pIVar9 = pIVar9->next) {
    Thread::join((Thread *)(pIVar9 + 1));
  }
  PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList(&this->_threads);
  Mutex::~Mutex(&this->_mutex);
  Signal::~Signal(&(this->_enqueuedSignal)._signal);
  Signal::~Signal(&(this->_dequeuedSignal)._signal);
  uVar6 = (this->_queue)._head - 1;
  do {
    uVar6 = uVar6 + 1;
  } while (uVar6 != (this->_queue)._tail);
  pNVar7 = (this->_queue)._queue;
  if (pNVar7 == (Node *)0x0) {
    return;
  }
  operator_delete__(pNVar7);
  return;
}

Assistant:

~ThreadPool()
    {
      Job job = {0, 0};
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
      {
        while (!_queue.push(job))
        {
          _dequeuedSignal.reset();
          if (_queue.push(job))
            break;
          _dequeuedSignal.wait();
        }
        _enqueuedSignal.set();
      }
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
        i->_thread.join();
    }